

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O0

int set_state(int i)

{
  int iVar1;
  int *piVar2;
  int local_c;
  int i_local;
  
  iVar1 = sem_wait((sem_t *)write_sem);
  if (iVar1 == 0) {
    buf->state = i;
    iVar1 = sem_post((sem_t *)write_sem);
    if (iVar1 == 0) {
      local_c = 0;
    }
    else {
      local_c = -1;
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      local_c = 1;
    }
    else {
      local_c = -1;
    }
  }
  return local_c;
}

Assistant:

int set_state(int i)
{
    if (sem_wait(write_sem) != 0)
    {
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }
    buf->state = i;
    if (sem_post(write_sem) != 0)
    {
        return -1;
    }
    return 0;
}